

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotManager.hpp
# Opt level: O0

void __thiscall OpenMD::SnapshotManager::~SnapshotManager(SnapshotManager *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  Snapshot *in_stack_ffffffffffffffe0;
  Snapshot *this_00;
  
  *in_RDI = &PTR__SnapshotManager_004e78a0;
  pvVar1 = (void *)in_RDI[3];
  if (pvVar1 != (void *)0x0) {
    Snapshot::~Snapshot(in_stack_ffffffffffffffe0);
    operator_delete(pvVar1,0xa98);
  }
  this_00 = (Snapshot *)in_RDI[4];
  if (this_00 != (Snapshot *)0x0) {
    Snapshot::~Snapshot(this_00);
    operator_delete(this_00,0xa98);
  }
  return;
}

Assistant:

virtual ~SnapshotManager() {
      delete currentSnapshot_;
      delete previousSnapshot_;
    }